

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O1

string * __thiscall
duckdb::FMTPrintf::
OP<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (string *__return_storage_ptr__,FMTPrintf *this,char *format_str,
          vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
          *format_args)

{
  long lVar1;
  long lVar2;
  undefined ***local_278;
  ulong local_270;
  long local_268;
  FMTPrintf *local_260;
  size_t local_258;
  undefined4 local_250;
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  lVar1 = *(long *)format_str;
  lVar2 = *(long *)(format_str + 8);
  lStack_238 = 0;
  local_248 = &PTR_grow_02497898;
  local_230 = 500;
  local_240 = local_228;
  local_258 = strlen((char *)this);
  local_278 = &local_248;
  local_250 = 0;
  local_270 = (ulong)(lVar2 - lVar1) >> 5 & 0xffffffff | 0x8000000000000000;
  local_268 = lVar1;
  local_260 = this;
  duckdb_fmt::v6::
  basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>::
  format<duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>>>
            ((basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
              *)&local_278);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_240,local_240 + lStack_238);
  local_248 = &PTR_grow_02497898;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

static string OP(const char *format_str, vector<duckdb_fmt::basic_format_arg<CTX>> &format_args) {
		return duckdb_fmt::vsprintf(
		    format_str, duckdb_fmt::basic_format_args<CTX>(format_args.data(), static_cast<int>(format_args.size())));
	}